

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O3

void alGenSources(ALsizei n,ALuint *sources)

{
  uint uVar1;
  iterator __position;
  pointer ptr;
  pointer pSVar2;
  ALsource *pAVar3;
  SourceSubList *pSVar4;
  char *pcVar5;
  ulong uVar6;
  ulong __n;
  ulong uVar7;
  ContextRef context;
  vector<ALuint> ids;
  unique_lock<std::mutex> srclock;
  ALCcontext *local_68;
  vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_> local_58;
  unique_lock<std::mutex> local_40;
  
  GetContextRef();
  if (local_68 != (ALCcontext *)0x0) {
    if (n < 0) {
      ALCcontext::setError(local_68,0xa003,"Generating %d sources",(ulong)(uint)n);
    }
    else if (n != 0) {
      local_40._M_device = &local_68->mSourceLock;
      local_40._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_40);
      local_40._M_owns = true;
      uVar1 = ((local_68->mDevice).mPtr)->SourcesMax;
      if (uVar1 - local_68->mNumSources < (uint)n) {
        ALCcontext::setError
                  (local_68,0xa005,"Exceeding %u source limit (%u + %d)",(ulong)uVar1,
                   (ulong)local_68->mNumSources,(ulong)(uint)n);
      }
      else {
        __n = (ulong)(uint)n;
        uVar7 = 0;
        for (pSVar2 = (local_68->mSourceList).
                      super__Vector_base<SourceSubList,_al::allocator<SourceSubList,_8UL>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pSVar2 != (local_68->mSourceList).
                      super__Vector_base<SourceSubList,_al::allocator<SourceSubList,_8UL>_>._M_impl.
                      super__Vector_impl_data._M_finish; pSVar2 = pSVar2 + 1) {
          uVar6 = pSVar2->FreeMask - (pSVar2->FreeMask >> 1 & 0x5555555555555555);
          uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333);
          uVar7 = uVar7 + (((uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
        }
        if (uVar7 < __n) {
          do {
            __position._M_current =
                 (local_68->mSourceList).
                 super__Vector_base<SourceSubList,_al::allocator<SourceSubList,_8UL>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (0x1ffffff0 <
                (ulong)((long)__position._M_current -
                       (long)(local_68->mSourceList).
                             super__Vector_base<SourceSubList,_al::allocator<SourceSubList,_8UL>_>.
                             _M_impl.super__Vector_impl_data._M_start)) {
LAB_00121d64:
              pcVar5 = "s";
              if (n == 1) {
                pcVar5 = "";
              }
              ALCcontext::setError
                        (local_68,0xa005,"Failed to allocate %d source%s",(ulong)(uint)n,pcVar5);
              goto LAB_00121d2c;
            }
            if (__position._M_current ==
                (local_68->mSourceList).
                super__Vector_base<SourceSubList,_al::allocator<SourceSubList,_8UL>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<SourceSubList,_al::allocator<SourceSubList,_8UL>_>::_M_realloc_insert<>
                        (&local_68->mSourceList,__position);
              pSVar4 = (local_68->mSourceList).
                       super__Vector_base<SourceSubList,_al::allocator<SourceSubList,_8UL>_>._M_impl
                       .super__Vector_impl_data._M_finish;
            }
            else {
              (__position._M_current)->FreeMask = 0xffffffffffffffff;
              (__position._M_current)->Sources = (ALsource *)0x0;
              pSVar4 = __position._M_current + 1;
              (local_68->mSourceList).
              super__Vector_base<SourceSubList,_al::allocator<SourceSubList,_8UL>_>._M_impl.
              super__Vector_impl_data._M_finish = pSVar4;
            }
            pSVar4[-1].FreeMask = 0xffffffffffffffff;
            pAVar3 = (ALsource *)al_calloc(8,0x6600);
            pSVar4[-1].Sources = pAVar3;
            if (pAVar3 == (ALsource *)0x0) {
              pSVar4 = (local_68->mSourceList).
                       super__Vector_base<SourceSubList,_al::allocator<SourceSubList,_8UL>_>._M_impl
                       .super__Vector_impl_data._M_finish + -1;
              (local_68->mSourceList).
              super__Vector_base<SourceSubList,_al::allocator<SourceSubList,_8UL>_>._M_impl.
              super__Vector_impl_data._M_finish = pSVar4;
              SourceSubList::~SourceSubList(pSVar4);
              goto LAB_00121d64;
            }
            uVar7 = uVar7 + 0x40;
          } while (uVar7 < __n);
        }
        if (n == 1) {
          pAVar3 = anon_unknown.dwarf_54919::AllocSource(local_68);
          *sources = pAVar3->id;
        }
        else {
          local_58.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_58.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
          super__Vector_impl_data._M_finish = (uint *)0x0;
          local_58.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
          std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::reserve(&local_58,__n);
          do {
            pAVar3 = anon_unknown.dwarf_54919::AllocSource(local_68);
            if (local_58.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl
                .super__Vector_impl_data._M_finish ==
                local_58.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,al::allocator<unsigned_int,4ul>>::
              _M_realloc_insert<unsigned_int&>
                        ((vector<unsigned_int,al::allocator<unsigned_int,4ul>> *)&local_58,
                         (iterator)
                         local_58.
                         super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl
                         .super__Vector_impl_data._M_finish,&pAVar3->id);
            }
            else {
              *local_58.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
               super__Vector_impl_data._M_finish = pAVar3->id;
              local_58.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_58.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            ptr = local_58.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                  _M_impl.super__Vector_impl_data._M_start;
            n = n + -1;
          } while (n != 0);
          if ((long)local_58.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_58.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                    _M_impl.super__Vector_impl_data._M_start != 0) {
            memmove(sources,local_58.
                            super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_58.
                          super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                          _M_impl.super__Vector_impl_data._M_start);
          }
          if (ptr != (pointer)0x0) {
            al_free(ptr);
          }
        }
      }
LAB_00121d2c:
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
    }
    if (local_68 != (ALCcontext *)0x0) {
      al::intrusive_ref<ALCcontext>::release(&local_68->super_intrusive_ref<ALCcontext>);
    }
  }
  return;
}

Assistant:

AL_API void AL_APIENTRY alGenSources(ALsizei n, ALuint *sources)
START_API_FUNC
{
    ContextRef context{GetContextRef()};
    if UNLIKELY(!context) return;

    if UNLIKELY(n < 0)
        context->setError(AL_INVALID_VALUE, "Generating %d sources", n);
    if UNLIKELY(n <= 0) return;

    std::unique_lock<std::mutex> srclock{context->mSourceLock};
    ALCdevice *device{context->mDevice.get()};
    if(static_cast<ALuint>(n) > device->SourcesMax-context->mNumSources)
    {
        context->setError(AL_OUT_OF_MEMORY, "Exceeding %u source limit (%u + %d)",
            device->SourcesMax, context->mNumSources, n);
        return;
    }
    if(!EnsureSources(context.get(), static_cast<ALuint>(n)))
    {
        context->setError(AL_OUT_OF_MEMORY, "Failed to allocate %d source%s", n, (n==1)?"":"s");
        return;
    }

    if(n == 1)
    {
        ALsource *source{AllocSource(context.get())};
        sources[0] = source->id;
    }
    else
    {
        al::vector<ALuint> ids;
        ids.reserve(static_cast<ALuint>(n));
        do {
            ALsource *source{AllocSource(context.get())};
            ids.emplace_back(source->id);
        } while(--n);
        std::copy(ids.cbegin(), ids.cend(), sources);
    }
}